

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

int __thiscall despot::EvalLog::GetNumCompletedRuns(EvalLog *this,string *instance)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  size_type *psVar4;
  long lVar5;
  
  pbVar1 = (this->runned_instances).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->runned_instances).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 5;
    __n = instance->_M_string_length;
    psVar4 = &pbVar1->_M_string_length;
    lVar3 = 0;
    do {
      if ((*psVar4 == __n) &&
         ((__n == 0 ||
          (iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar4 + -1))->_M_dataplus)._M_p,(instance->_M_dataplus)._M_p,__n),
          iVar2 == 0)))) {
        return (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3];
      }
      lVar3 = lVar3 + 1;
      psVar4 = psVar4 + 4;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar3);
  }
  return 0;
}

Assistant:

int EvalLog::GetNumCompletedRuns(string instance) const {
	for (int i = 0; i < runned_instances.size(); i++) {
		if (runned_instances[i] == instance)
			return num_of_completed_runs[i];
	}
	return 0;
}